

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EVMMapping.c
# Opt level: O1

void EVM_get_insn_id(cs_struct *h,cs_insn *insn,uint id)

{
  insn->id = id;
  if ((((id < 0x100) && (id != 0)) && (insns[id].fee != 0xffffffff)) && (h->detail != CS_OPT_OFF)) {
    (insn->detail->field_6).m68k.operands[0].field_0 =
         *(anon_union_8_5_85a7a27f_for_cs_m68k_op_0 *)(insns + id);
  }
  return;
}

Assistant:

void EVM_get_insn_id(cs_struct *h, cs_insn *insn, unsigned int id)
{
	insn->id = id;
#ifndef CAPSTONE_DIET
	if (evm_insn_find(insns, ARR_SIZE(insns), id) > 0) {
		if (h->detail) {
			memcpy(&insn->detail->evm, &insns[id], sizeof(insns[id]));
		}
	}
#endif
}